

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void updateVirtualTable(Parse *pParse,SrcList *pSrc,Table *pTab,ExprList *pChanges,Expr *pRowid,
                       int *aXRef,Expr *pWhere,int onError)

{
  u8 uVar1;
  short sVar2;
  short sVar3;
  int p1;
  Vdbe *p;
  Index *pIVar4;
  int addr;
  int iVar5;
  WhereInfo *pWInfo;
  Parse *pPVar6;
  int p2;
  Index **ppIVar7;
  Op *pOVar8;
  int p1_00;
  int iVar9;
  int p2_00;
  int iVar10;
  int op;
  VTable *zP4;
  int iVar11;
  long lVar12;
  
  p = pParse->pVdbe;
  zP4 = pTab->pVTable;
  if (zP4 != (VTable *)0x0) {
    do {
      if (zP4->db == pParse->db) goto LAB_001977b9;
      zP4 = zP4->pNext;
    } while (zP4 != (VTable *)0x0);
  }
  zP4 = (VTable *)0x0;
LAB_001977b9:
  sVar2 = pTab->nCol;
  iVar9 = (int)sVar2;
  p2 = iVar9 + 2;
  iVar5 = pSrc->a[0].iCursor;
  p1 = pParse->nTab;
  pParse->nTab = p1 + 1;
  addr = sqlite3VdbeAddOp3(p,0x71,p1,p2,0);
  iVar11 = pParse->nMem;
  p2_00 = iVar11 + 4 + iVar9;
  pParse->nMem = p2_00;
  pWInfo = sqlite3WhereBegin(pParse,pSrc,pWhere,(ExprList *)0x0,(ExprList *)0x0,4,0);
  if (pWInfo == (WhereInfo *)0x0) {
    return;
  }
  if (0 < pTab->nCol) {
    lVar12 = 0;
    do {
      iVar10 = (int)lVar12;
      if ((long)aXRef[lVar12] < 0) {
        sqlite3VdbeAddOp3(p,0xa5,iVar5,iVar10,iVar10 + iVar11 + 3);
        if (0 < (long)p->nOp) {
          p->aOp[(long)p->nOp + -1].p5 = 1;
        }
      }
      else {
        sqlite3ExprCode(pParse,pChanges->a[aXRef[lVar12]].pExpr,iVar10 + iVar11 + 3);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pTab->nCol);
  }
  iVar10 = iVar11 + 1;
  if ((pTab->tabFlags & 0x20) == 0) {
    sqlite3VdbeAddOp3(p,0x81,iVar5,iVar10,0);
    if (pRowid != (Expr *)0x0) {
      sqlite3ExprCode(pParse,pRowid,iVar11 + 2);
      goto LAB_001979a3;
    }
    op = 0x81;
    p1_00 = iVar5;
  }
  else {
    ppIVar7 = &pTab->pIndex;
    do {
      pIVar4 = *ppIVar7;
      ppIVar7 = &pIVar4->pNext;
    } while ((*(ushort *)&pIVar4->field_0x63 & 3) != 2);
    sVar3 = *pIVar4->aiColumn;
    sqlite3VdbeAddOp3(p,0xa5,iVar5,(int)sVar3,iVar10);
    p1_00 = sVar3 + iVar11 + 3;
    op = 0x4f;
  }
  sqlite3VdbeAddOp3(p,op,p1_00,iVar11 + 2,0);
LAB_001979a3:
  uVar1 = pWInfo->eOnePass;
  if (uVar1 == '\0') {
    iVar5 = iVar11 + iVar9 + 3;
    pPVar6 = pParse->pToplevel;
    if (pParse->pToplevel == (Parse *)0x0) {
      pPVar6 = pParse;
    }
    pPVar6->isMultiWrite = '\x01';
    sqlite3VdbeAddOp3(p,0x66,iVar10,p2,iVar5);
    iVar11 = 0;
    sqlite3VdbeAddOp3(p,0x79,p1,p2_00,0);
    sqlite3VdbeAddOp3(p,0x7a,p1,iVar5,p2_00);
    sqlite3WhereEnd(pWInfo);
    addr = sqlite3VdbeAddOp3(p,0x24,p1,0,0);
    if (-2 < sVar2) {
      do {
        sqlite3VdbeAddOp3(p,0x5a,p1,iVar11,iVar11 + iVar10);
        iVar11 = iVar11 + 1;
      } while (p2 != iVar11);
    }
  }
  else {
    sqlite3VdbeChangeToNoop(p,addr);
    sqlite3VdbeAddOp3(p,0x75,iVar5,0,0);
  }
  sqlite3VtabMakeWritable(pParse,pTab);
  iVar5 = sqlite3VdbeAddOp3(p,10,0,p2,iVar10);
  sqlite3VdbeChangeP4(p,iVar5,(char *)zP4,-0xc);
  if (0 < (long)p->nOp) {
    iVar5 = 2;
    if (onError != 0xb) {
      iVar5 = onError;
    }
    p->aOp[(long)p->nOp + -1].p5 = (u16)iVar5;
  }
  pPVar6 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar6 = pParse;
  }
  pPVar6->mayAbort = '\x01';
  if (uVar1 == '\0') {
    sqlite3VdbeAddOp3(p,5,p1,addr + 1,0);
    if (p->db->mallocFailed == '\0') {
      iVar5 = p->nOp + -1;
      if (-1 < addr) {
        iVar5 = addr;
      }
      pOVar8 = p->aOp + iVar5;
    }
    else {
      pOVar8 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar8->p2 = p->nOp;
    sqlite3VdbeAddOp3(p,0x75,p1,0,0);
    return;
  }
  sqlite3WhereEnd(pWInfo);
  return;
}

Assistant:

static void updateVirtualTable(
  Parse *pParse,       /* The parsing context */
  SrcList *pSrc,       /* The virtual table to be modified */
  Table *pTab,         /* The virtual table */
  ExprList *pChanges,  /* The columns to change in the UPDATE statement */
  Expr *pRowid,        /* Expression used to recompute the rowid */
  int *aXRef,          /* Mapping from columns of pTab to entries in pChanges */
  Expr *pWhere,        /* WHERE clause of the UPDATE statement */
  int onError          /* ON CONFLICT strategy */
){
  Vdbe *v = pParse->pVdbe;  /* Virtual machine under construction */
  int ephemTab;             /* Table holding the result of the SELECT */
  int i;                    /* Loop counter */
  sqlite3 *db = pParse->db; /* Database connection */
  const char *pVTab = (const char*)sqlite3GetVTable(db, pTab);
  WhereInfo *pWInfo;
  int nArg = 2 + pTab->nCol;      /* Number of arguments to VUpdate */
  int regArg;                     /* First register in VUpdate arg array */
  int regRec;                     /* Register in which to assemble record */
  int regRowid;                   /* Register for ephem table rowid */
  int iCsr = pSrc->a[0].iCursor;  /* Cursor used for virtual table scan */
  int aDummy[2];                  /* Unused arg for sqlite3WhereOkOnePass() */
  int eOnePass;                   /* True to use onepass strategy */
  int addr;                       /* Address of OP_OpenEphemeral */

  /* Allocate nArg registers in which to gather the arguments for VUpdate. Then
  ** create and open the ephemeral table in which the records created from
  ** these arguments will be temporarily stored. */
  assert( v );
  ephemTab = pParse->nTab++;
  addr= sqlite3VdbeAddOp2(v, OP_OpenEphemeral, ephemTab, nArg);
  regArg = pParse->nMem + 1;
  pParse->nMem += nArg;
  regRec = ++pParse->nMem;
  regRowid = ++pParse->nMem;

  /* Start scanning the virtual table */
  pWInfo = sqlite3WhereBegin(pParse, pSrc, pWhere, 0,0,WHERE_ONEPASS_DESIRED,0);
  if( pWInfo==0 ) return;

  /* Populate the argument registers. */
  for(i=0; i<pTab->nCol; i++){
    if( aXRef[i]>=0 ){
      sqlite3ExprCode(pParse, pChanges->a[aXRef[i]].pExpr, regArg+2+i);
    }else{
      sqlite3VdbeAddOp3(v, OP_VColumn, iCsr, i, regArg+2+i);
      sqlite3VdbeChangeP5(v, 1); /* Enable sqlite3_vtab_nochange() */
    }
  }
  if( HasRowid(pTab) ){
    sqlite3VdbeAddOp2(v, OP_Rowid, iCsr, regArg);
    if( pRowid ){
      sqlite3ExprCode(pParse, pRowid, regArg+1);
    }else{
      sqlite3VdbeAddOp2(v, OP_Rowid, iCsr, regArg+1);
    }
  }else{
    Index *pPk;   /* PRIMARY KEY index */
    i16 iPk;      /* PRIMARY KEY column */
    pPk = sqlite3PrimaryKeyIndex(pTab);
    assert( pPk!=0 );
    assert( pPk->nKeyCol==1 );
    iPk = pPk->aiColumn[0];
    sqlite3VdbeAddOp3(v, OP_VColumn, iCsr, iPk, regArg);
    sqlite3VdbeAddOp2(v, OP_SCopy, regArg+2+iPk, regArg+1);
  }

  eOnePass = sqlite3WhereOkOnePass(pWInfo, aDummy);

  /* There is no ONEPASS_MULTI on virtual tables */
  assert( eOnePass==ONEPASS_OFF || eOnePass==ONEPASS_SINGLE );

  if( eOnePass ){
    /* If using the onepass strategy, no-op out the OP_OpenEphemeral coded
    ** above. */
    sqlite3VdbeChangeToNoop(v, addr);
    sqlite3VdbeAddOp1(v, OP_Close, iCsr);
  }else{
    /* Create a record from the argument register contents and insert it into
    ** the ephemeral table. */
    sqlite3MultiWrite(pParse);
    sqlite3VdbeAddOp3(v, OP_MakeRecord, regArg, nArg, regRec);
#ifdef SQLITE_DEBUG
    /* Signal an assert() within OP_MakeRecord that it is allowed to
    ** accept no-change records with serial_type 10 */
    sqlite3VdbeChangeP5(v, OPFLAG_NOCHNG_MAGIC);
#endif
    sqlite3VdbeAddOp2(v, OP_NewRowid, ephemTab, regRowid);
    sqlite3VdbeAddOp3(v, OP_Insert, ephemTab, regRec, regRowid);
  }


  if( eOnePass==ONEPASS_OFF ){
    /* End the virtual table scan */
    sqlite3WhereEnd(pWInfo);

    /* Begin scannning through the ephemeral table. */
    addr = sqlite3VdbeAddOp1(v, OP_Rewind, ephemTab); VdbeCoverage(v);

    /* Extract arguments from the current row of the ephemeral table and 
    ** invoke the VUpdate method.  */
    for(i=0; i<nArg; i++){
      sqlite3VdbeAddOp3(v, OP_Column, ephemTab, i, regArg+i);
    }
  }
  sqlite3VtabMakeWritable(pParse, pTab);
  sqlite3VdbeAddOp4(v, OP_VUpdate, 0, nArg, regArg, pVTab, P4_VTAB);
  sqlite3VdbeChangeP5(v, onError==OE_Default ? OE_Abort : onError);
  sqlite3MayAbort(pParse);

  /* End of the ephemeral table scan. Or, if using the onepass strategy,
  ** jump to here if the scan visited zero rows. */
  if( eOnePass==ONEPASS_OFF ){
    sqlite3VdbeAddOp2(v, OP_Next, ephemTab, addr+1); VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, addr);
    sqlite3VdbeAddOp2(v, OP_Close, ephemTab, 0);
  }else{
    sqlite3WhereEnd(pWInfo);
  }
}